

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Vocabulary.h
# Opt level: O2

void __thiscall NotFoundException::NotFoundException(NotFoundException *this,string *name)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> bStack_38;
  
  *(undefined ***)this = &PTR__NotFoundException_00147d28;
  (this->error_message)._M_dataplus._M_p = (pointer)&(this->error_message).field_2;
  (this->error_message)._M_string_length = 0;
  (this->error_message).field_2._M_local_buf[0] = '\0';
  std::operator+(&bStack_38,name," is not found");
  std::__cxx11::string::operator=((string *)&this->error_message,(string *)&bStack_38);
  std::__cxx11::string::~string((string *)&bStack_38);
  return;
}

Assistant:

NotFoundException(string name) {
        this->error_message = name + " is not found";
    }